

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

AbstractStreamReader *
METADemuxer::createCodec
          (string *codecName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams,string *codecStreamName,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 this;
  bool bVar4;
  uint8_t value;
  VideoAspectRatio ar;
  int32_t iVar5;
  ulong uVar6;
  ostream *poVar7;
  VodCoreException *pVVar8;
  char *pcVar9;
  long lVar10;
  pointer ppVar11;
  SimplePacketizerReader *local_12e0;
  long local_12d0;
  SimplePacketizerReader *local_1230;
  PGSStreamReader *local_1128;
  PGSStreamReader *local_1100;
  PGSStreamReader *local_10a0;
  PGSStreamReader *local_1070;
  long local_1040;
  DTSStreamReader *local_1010;
  MPEGStreamReader *local_f80;
  MPEGStreamReader *local_f50;
  MPEGStreamReader *local_f28;
  MPEGStreamReader *local_ef8;
  MPEGStreamReader *local_ed0;
  MPEGStreamReader *local_ea0;
  MPEGStreamReader *local_e70;
  H264StreamReader *local_e40;
  H264StreamReader *local_e18;
  H264StreamReader *local_df0;
  H264StreamReader *local_dc8;
  H264StreamReader *local_d98;
  MPEGStreamReader *local_d70;
  MPEGStreamReader *local_d48;
  _Self local_d18;
  allocator<char> local_d09;
  key_type local_d08;
  _Base_ptr local_ce8;
  _Self local_ce0;
  allocator<char> local_cd1;
  key_type local_cd0;
  _Base_ptr local_cb0;
  _Self local_ca8;
  allocator<char> local_c99;
  key_type local_c98;
  _Base_ptr local_c78;
  _Self local_c70;
  allocator<char> local_c61;
  key_type local_c60;
  _Base_ptr local_c40;
  _Self local_c38;
  allocator<char> local_c29;
  key_type local_c28;
  _Base_ptr local_c08;
  undefined1 local_bfc [8];
  PIPParams pipParams;
  allocator<char> local_bd9;
  key_type local_bd8;
  _Self local_bb8;
  const_iterator itr;
  string local_ba0;
  ostringstream local_b80 [8];
  ostringstream ss_2;
  double dSecond;
  double dFirst;
  string secondStr;
  string firstStr;
  size_t divPos;
  double stretch;
  allocator<char> local_999;
  key_type local_998;
  _Self local_978;
  const_iterator itr_9;
  string local_968;
  ostringstream local_948 [8];
  ostringstream ss_1;
  string local_7c8;
  ostringstream local_7a8 [8];
  ostringstream ss;
  string local_630 [32];
  string local_610 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  string *s;
  reference local_5c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *addParam;
  const_iterator __end15;
  const_iterator __begin15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range15;
  TextAnimation animation;
  double fps_6;
  undefined1 local_590 [4];
  uint16_t srtHeight;
  uint16_t srtWidth;
  Font font;
  SRTStreamReader *srtReader;
  allocator<char> local_541;
  key_type local_540;
  _Base_ptr local_520;
  _Self local_518;
  allocator<char> local_509;
  key_type local_508;
  _Base_ptr local_4e8;
  _Self local_4e0;
  allocator<char> local_4d1;
  key_type local_4d0;
  _Base_ptr local_4b0;
  _Self local_4a8;
  allocator<char> local_499;
  key_type local_498;
  _Base_ptr local_478;
  uint16_t local_46c;
  uint16_t local_46a;
  uint16_t height;
  double dStack_468;
  uint16_t width;
  double fps_5;
  allocator<char> local_451;
  key_type local_450;
  _Base_ptr local_430;
  _Self local_428;
  allocator<char> local_419;
  key_type local_418;
  _Self local_3f8;
  const_iterator itr_8;
  allocator<char> local_3e1;
  key_type local_3e0;
  _Self local_3c0;
  const_iterator itr_7;
  allocator<char> local_3a9;
  key_type local_3a8;
  _Self local_388;
  const_iterator itr_6;
  allocator<char> local_371;
  key_type local_370;
  _Base_ptr local_350;
  _Self local_348;
  allocator<char> local_339;
  key_type local_338;
  _Base_ptr local_318;
  double local_310;
  double fps_4;
  allocator<char> local_2f9;
  key_type local_2f8;
  _Self local_2d8;
  const_iterator itr_5;
  allocator<char> local_2c1;
  key_type local_2c0;
  _Base_ptr local_2a0;
  double local_298;
  double fps_3;
  allocator<char> local_281;
  key_type local_280;
  _Self local_260;
  const_iterator itr_4;
  double fps_2;
  allocator<char> local_241;
  key_type local_240;
  _Self local_220;
  const_iterator itr_3;
  double fps_1;
  allocator<char> local_201;
  key_type local_200;
  _Self local_1e0;
  const_iterator itr_2;
  allocator<char> local_1c9;
  key_type local_1c8;
  _Base_ptr local_1a8;
  _Self local_1a0;
  allocator<char> local_191;
  key_type local_190;
  _Base_ptr local_170;
  _Self local_168;
  allocator<char> local_159;
  key_type local_158;
  _Base_ptr local_138;
  _Self local_130;
  allocator<char> local_121;
  key_type local_120;
  _Base_ptr local_100;
  _Self local_f8;
  allocator<char> local_e9;
  key_type local_e8;
  _Base_ptr local_c8;
  _Self local_c0;
  allocator<char> local_b1;
  key_type local_b0;
  _Base_ptr local_90;
  double local_88;
  double fps;
  allocator<char> local_71;
  key_type local_70;
  _Self local_50;
  const_iterator itr_1;
  H264StreamReader *h264Reader;
  AbstractStreamReader *rez;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo_local;
  string *codecStreamName_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *addParams_local;
  string *codecName_local;
  
  bVar4 = std::operator==(codecName,"V_MPEG4/ISO/AVC");
  if ((bVar4) || (bVar4 = std::operator==(codecName,"V_MPEG4/ISO/MVC"), bVar4)) {
    h264Reader = (H264StreamReader *)operator_new(0x250);
    H264StreamReader::H264StreamReader(h264Reader);
    bVar4 = std::operator==(codecName,"V_MPEG4/ISO/MVC");
    if (bVar4) {
      H264StreamReader::setIsSubStream(h264Reader,true);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"fps",&local_71);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(addParams,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    fps = (double)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(addParams);
    bVar4 = std::operator!=(&local_50,(_Self *)&fps);
    if (bVar4) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_50);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      local_88 = strToDouble(pcVar9);
      local_88 = correctFps(local_88);
      if (h264Reader == (H264StreamReader *)0x0) {
        local_d48 = (MPEGStreamReader *)0x0;
      }
      else {
        local_d48 = (MPEGStreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      MPEGStreamReader::setFPS(local_d48,local_88);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"delPulldown",&local_b1);
    local_90 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(addParams,&local_b0);
    local_50._M_node = local_90;
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar4 = std::operator!=(&local_50,&local_c0);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_d70 = (MPEGStreamReader *)0x0;
      }
      else {
        local_d70 = (MPEGStreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      MPEGStreamReader::setRemovePulldown(local_d70,true);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"level",&local_e9);
    local_c8 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(addParams,&local_e8);
    local_50._M_node = local_c8;
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar4 = std::operator!=(&local_50,&local_f8);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_d98 = (H264StreamReader *)0x0;
      }
      else {
        local_d98 = (H264StreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_50);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      dVar1 = strToDouble(pcVar9);
      H264StreamReader::setForceLevel(local_d98,(char)(int)dVar1 * '\n');
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"insertSEI",&local_121);
    local_100 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(addParams,&local_120);
    local_50._M_node = local_100;
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    local_130._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar4 = std::operator!=(&local_50,&local_130);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_dc8 = (H264StreamReader *)0x0;
      }
      else {
        local_dc8 = (H264StreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      H264StreamReader::setInsertSEI(local_dc8,SEI_InsertAuto);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"autoSEI",&local_159);
    local_138 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(addParams,&local_158);
    local_50._M_node = local_138;
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    local_168._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar4 = std::operator!=(&local_50,&local_168);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_df0 = (H264StreamReader *)0x0;
      }
      else {
        local_df0 = (H264StreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      H264StreamReader::setInsertSEI(local_df0,SEI_InsertAuto);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"forceSEI",&local_191);
    local_170 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(addParams,&local_190);
    local_50._M_node = local_170;
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    local_1a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar4 = std::operator!=(&local_50,&local_1a0);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_e18 = (H264StreamReader *)0x0;
      }
      else {
        local_e18 = (H264StreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      H264StreamReader::setInsertSEI(local_e18,SEI_InsertForce);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"contSPS",&local_1c9);
    local_1a8 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(addParams,&local_1c8);
    local_50._M_node = local_1a8;
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    itr_2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(addParams);
    bVar4 = std::operator!=(&local_50,&itr_2);
    if (bVar4) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_e40 = (H264StreamReader *)0x0;
      }
      else {
        local_e40 = (H264StreamReader *)
                    __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                   &H264StreamReader::typeinfo,0);
      }
      H264StreamReader::setH264SPSCont(local_e40,true);
    }
  }
  else {
    bVar4 = std::operator==(codecName,"V_MPEGH/ISO/HEVC");
    if (bVar4) {
      h264Reader = (H264StreamReader *)operator_new(0x198);
      HEVCStreamReader::HEVCStreamReader((HEVCStreamReader *)h264Reader);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"fps",&local_201);
      local_1e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(addParams,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      fps_1 = (double)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::end(addParams);
      bVar4 = std::operator!=(&local_1e0,(_Self *)&fps_1);
      if (bVar4) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->(&local_1e0);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        itr_3._M_node = (_Base_ptr)strToDouble(pcVar9);
        itr_3._M_node = (_Base_ptr)correctFps((double)itr_3._M_node);
        if (h264Reader == (H264StreamReader *)0x0) {
          local_e70 = (MPEGStreamReader *)0x0;
        }
        else {
          local_e70 = (MPEGStreamReader *)
                      __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                     &HEVCStreamReader::typeinfo,0);
        }
        MPEGStreamReader::setFPS(local_e70,(double)itr_3._M_node);
      }
    }
    else {
      bVar4 = std::operator==(codecName,"V_MPEGI/ISO/VVC");
      if (bVar4) {
        h264Reader = (H264StreamReader *)operator_new(400);
        VVCStreamReader::VVCStreamReader((VVCStreamReader *)h264Reader);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"fps",&local_241);
        local_220._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(addParams,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator(&local_241);
        fps_2 = (double)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::end(addParams);
        bVar4 = std::operator!=(&local_220,(_Self *)&fps_2);
        if (bVar4) {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_220);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          itr_4._M_node = (_Base_ptr)strToDouble(pcVar9);
          itr_4._M_node = (_Base_ptr)correctFps((double)itr_4._M_node);
          if (h264Reader == (H264StreamReader *)0x0) {
            local_ea0 = (MPEGStreamReader *)0x0;
          }
          else {
            local_ea0 = (MPEGStreamReader *)
                        __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                       &VVCStreamReader::typeinfo,0);
          }
          MPEGStreamReader::setFPS(local_ea0,(double)itr_4._M_node);
        }
      }
      else {
        bVar4 = std::operator==(codecName,"V_MS/VFW/WVC1");
        if (bVar4) {
          h264Reader = (H264StreamReader *)operator_new(0x1f8);
          VC1StreamReader::VC1StreamReader((VC1StreamReader *)h264Reader);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"fps",&local_281);
          local_260._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(addParams,&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          fps_3 = (double)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::end(addParams);
          bVar4 = std::operator!=(&local_260,(_Self *)&fps_3);
          if (bVar4) {
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator->(&local_260);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            local_298 = strToDouble(pcVar9);
            local_298 = correctFps(local_298);
            if (h264Reader == (H264StreamReader *)0x0) {
              local_ed0 = (MPEGStreamReader *)0x0;
            }
            else {
              local_ed0 = (MPEGStreamReader *)
                          __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                         &VC1StreamReader::typeinfo,0);
            }
            MPEGStreamReader::setFPS(local_ed0,local_298);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,"delPulldown",&local_2c1);
          local_2a0 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(addParams,&local_2c0);
          local_260._M_node = local_2a0;
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          itr_5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(addParams);
          bVar4 = std::operator!=(&local_260,&itr_5);
          if (bVar4) {
            if (h264Reader == (H264StreamReader *)0x0) {
              local_ef8 = (MPEGStreamReader *)0x0;
            }
            else {
              local_ef8 = (MPEGStreamReader *)
                          __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                         &VC1StreamReader::typeinfo,0);
            }
            MPEGStreamReader::setRemovePulldown(local_ef8,true);
          }
        }
        else {
          bVar4 = std::operator==(codecName,"V_MPEG-2");
          if (bVar4) {
            h264Reader = (H264StreamReader *)operator_new(600);
            MPEG2StreamReader::MPEG2StreamReader((MPEG2StreamReader *)h264Reader);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f8,"fps",&local_2f9);
            local_2d8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(addParams,&local_2f8);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator(&local_2f9);
            fps_4 = (double)std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::end(addParams);
            bVar4 = std::operator!=(&local_2d8,(_Self *)&fps_4);
            if (bVar4) {
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_2d8);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              local_310 = strToDouble(pcVar9);
              local_310 = correctFps(local_310);
              if ((MPEG2StreamReader *)h264Reader == (MPEG2StreamReader *)0x0) {
                local_f28 = (MPEGStreamReader *)0x0;
              }
              else {
                local_f28 = (MPEGStreamReader *)
                            __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                           &MPEG2StreamReader::typeinfo,0);
              }
              MPEGStreamReader::setFPS(local_f28,local_310);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"ar",&local_339)
            ;
            local_318 = (_Base_ptr)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(addParams,&local_338);
            local_2d8._M_node = local_318;
            std::__cxx11::string::~string((string *)&local_338);
            std::allocator<char>::~allocator(&local_339);
            local_348._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(addParams);
            bVar4 = std::operator!=(&local_2d8,&local_348);
            if (bVar4) {
              if ((MPEG2StreamReader *)h264Reader == (MPEG2StreamReader *)0x0) {
                local_f50 = (MPEGStreamReader *)0x0;
              }
              else {
                local_f50 = (MPEGStreamReader *)
                            __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                           &MPEGStreamReader::typeinfo,0);
              }
              ppVar11 = std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->(&local_2d8);
              ar = arNameToCode(&ppVar11->second);
              MPEGStreamReader::setAspectRatio(local_f50,ar);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_370,"delPulldown",&local_371);
            local_350 = (_Base_ptr)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(addParams,&local_370);
            local_2d8._M_node = local_350;
            std::__cxx11::string::~string((string *)&local_370);
            std::allocator<char>::~allocator(&local_371);
            itr_6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(addParams);
            bVar4 = std::operator!=(&local_2d8,&itr_6);
            if (bVar4) {
              if ((MPEG2StreamReader *)h264Reader == (MPEG2StreamReader *)0x0) {
                local_f80 = (MPEGStreamReader *)0x0;
              }
              else {
                local_f80 = (MPEGStreamReader *)
                            __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                           &MPEG2StreamReader::typeinfo,0);
              }
              MPEGStreamReader::setRemovePulldown(local_f80,true);
            }
          }
          else {
            bVar4 = std::operator==(codecName,"A_AAC");
            if (bVar4) {
              h264Reader = (H264StreamReader *)operator_new(0xf8);
              h264Reader->m_bSliceFound = false;
              *(undefined3 *)&h264Reader->field_0xe1 = 0;
              h264Reader->m_picOrderOffset = 0;
              *(undefined8 *)&h264Reader->m_frameDepth = 0;
              (h264Reader->super_MPEGStreamReader).m_lastDecodeOffset = 0;
              (h264Reader->super_MPEGStreamReader).m_syncToStream = false;
              (h264Reader->super_MPEGStreamReader).m_isFirstFpsWarn = false;
              (h264Reader->super_MPEGStreamReader).field_0xda = false;
              (h264Reader->super_MPEGStreamReader).field_0xdb = false;
              *(int *)&(h264Reader->super_MPEGStreamReader).field_0xdc = 0;
              (((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
               &(h264Reader->super_MPEGStreamReader).m_spsPpsFound)->
              super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (h264Reader->super_MPEGStreamReader).m_pulldownWarnCnt = 0;
              (h264Reader->super_MPEGStreamReader).m_testPulldownDts = 0;
              (h264Reader->super_MPEGStreamReader).m_tmpBuffer = (uint8_t *)0x0;
              (h264Reader->super_MPEGStreamReader).m_lastDecodedPos = (uint8_t *)0x0;
              *(double *)&(h264Reader->super_MPEGStreamReader).m_totalFrameNum = 0.0;
              (h264Reader->super_MPEGStreamReader).m_pcrIncPerFrame = 0;
              (h264Reader->super_MPEGStreamReader).m_pcrIncPerField = 0;
              *(int64_t *)&(h264Reader->super_MPEGStreamReader).m_eof = 0;
              (h264Reader->super_MPEGStreamReader).m_fps = 0.0;
              (h264Reader->super_MPEGStreamReader).m_curDts = 0;
              (h264Reader->super_MPEGStreamReader).m_processedBytes = 0;
              *(double *)&(h264Reader->super_MPEGStreamReader).m_shortStartCodes = 0.0;
              (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(h264Reader->super_MPEGStreamReader).m_curPts)->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.vOffset =
                   0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.lumma = 0;
              (h264Reader->super_MPEGStreamReader).m_ar = AR_KEEP_DEFAULT;
              (h264Reader->super_MPEGStreamReader).m_streamAR = AR_KEEP_DEFAULT;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_demuxMode = false;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_secondary = false;
              *(undefined2 *)
               &(h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.field_0x42 = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.scaleIndex
                   = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.corner =
                   TopLeft;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.hOffset =
                   0;
              *(undefined8 *)
               &(h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_streamIndex = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_tmpBufferLen = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_curPos =
                   (uint8_t *)0x0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd =
                   (uint8_t *)0x0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_timeOffset = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer =
                   (uint8_t *)0x0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.
              super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader = (_func_int **)0x0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_flags = 0;
              (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_containerType =
                   ctNone;
              h264Reader->m_h264SPSCont = false;
              h264Reader->m_lastSliceIDR = false;
              *(undefined2 *)&h264Reader->field_0xf2 = 0;
              h264Reader->m_lastSliceSPS = 0;
              AACStreamReader::AACStreamReader((AACStreamReader *)h264Reader);
            }
            else {
              bVar4 = std::operator==(codecName,"A_MP3");
              if (bVar4) {
                h264Reader = (H264StreamReader *)operator_new(0xf8);
                h264Reader->m_bSliceFound = false;
                *(undefined3 *)&h264Reader->field_0xe1 = 0;
                h264Reader->m_picOrderOffset = 0;
                h264Reader->m_frameDepth = 0;
                h264Reader->m_spsCounter = 0;
                (h264Reader->super_MPEGStreamReader).m_lastDecodeOffset = 0;
                (h264Reader->super_MPEGStreamReader).m_syncToStream = false;
                (h264Reader->super_MPEGStreamReader).m_isFirstFpsWarn = false;
                (h264Reader->super_MPEGStreamReader).field_0xda = false;
                (h264Reader->super_MPEGStreamReader).field_0xdb = false;
                *(int *)&(h264Reader->super_MPEGStreamReader).field_0xdc = 0;
                (((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                 &(h264Reader->super_MPEGStreamReader).m_spsPpsFound)->
                super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (h264Reader->super_MPEGStreamReader).m_pulldownWarnCnt = 0;
                (h264Reader->super_MPEGStreamReader).m_testPulldownDts = 0;
                (h264Reader->super_MPEGStreamReader).m_tmpBuffer = (uint8_t *)0x0;
                (h264Reader->super_MPEGStreamReader).m_lastDecodedPos = (uint8_t *)0x0;
                *(double *)&(h264Reader->super_MPEGStreamReader).m_totalFrameNum = 0.0;
                (h264Reader->super_MPEGStreamReader).m_pcrIncPerFrame = 0;
                (h264Reader->super_MPEGStreamReader).m_pcrIncPerField = 0;
                *(int64_t *)&(h264Reader->super_MPEGStreamReader).m_eof = 0;
                (h264Reader->super_MPEGStreamReader).m_fps = 0.0;
                (h264Reader->super_MPEGStreamReader).m_curDts = 0;
                (h264Reader->super_MPEGStreamReader).m_processedBytes = 0;
                *(double *)&(h264Reader->super_MPEGStreamReader).m_shortStartCodes = 0.0;
                (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &(h264Reader->super_MPEGStreamReader).m_curPts)->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.vOffset
                     = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.lumma =
                     0;
                (h264Reader->super_MPEGStreamReader).m_ar = AR_KEEP_DEFAULT;
                (h264Reader->super_MPEGStreamReader).m_streamAR = AR_KEEP_DEFAULT;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_demuxMode = false;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_secondary = false;
                *(undefined2 *)
                 &(h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.field_0x42 = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.
                scaleIndex = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.corner =
                     TopLeft;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_pipParams.hOffset
                     = 0;
                *(undefined8 *)
                 &(h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_streamIndex = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_tmpBufferLen = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_curPos =
                     (uint8_t *)0x0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd =
                     (uint8_t *)0x0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_timeOffset = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer =
                     (uint8_t *)0x0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.
                super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader = (_func_int **)0x0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_flags = 0;
                (h264Reader->super_MPEGStreamReader).super_AbstractStreamReader.m_containerType =
                     ctNone;
                h264Reader->m_h264SPSCont = false;
                h264Reader->m_lastSliceIDR = false;
                *(undefined2 *)&h264Reader->field_0xf2 = 0;
                h264Reader->m_lastSliceSPS = 0;
                MpegAudioStreamReader::MpegAudioStreamReader((MpegAudioStreamReader *)h264Reader);
              }
              else {
                bVar4 = std::operator==(codecName,"S_SUP");
                if (bVar4) {
                  h264Reader = (H264StreamReader *)operator_new(0x100);
                  DVBSubStreamReader::DVBSubStreamReader((DVBSubStreamReader *)h264Reader);
                }
                else {
                  bVar4 = std::operator==(codecName,"A_LPCM");
                  if (bVar4) {
                    h264Reader = (H264StreamReader *)operator_new(0x4490);
                    LPCMStreamReader::LPCMStreamReader((LPCMStreamReader *)h264Reader);
                  }
                  else {
                    bVar4 = std::operator==(codecName,"A_MLP");
                    if (bVar4) {
                      h264Reader = (H264StreamReader *)operator_new(0x100);
                      MLPStreamReader::MLPStreamReader((MLPStreamReader *)h264Reader);
                    }
                    else {
                      bVar4 = std::operator==(codecName,"A_DTS");
                      if (bVar4) {
                        h264Reader = (H264StreamReader *)operator_new(0x150);
                        DTSStreamReader::DTSStreamReader((DTSStreamReader *)h264Reader);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3a8,"down-to-dts",&local_3a9);
                        local_388._M_node =
                             (_Base_ptr)
                             std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::find(addParams,&local_3a8);
                        std::__cxx11::string::~string((string *)&local_3a8);
                        std::allocator<char>::~allocator(&local_3a9);
                        itr_7 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::end(addParams);
                        bVar4 = std::operator!=(&local_388,&itr_7);
                        if (bVar4) {
                          if (h264Reader == (H264StreamReader *)0x0) {
                            local_1010 = (DTSStreamReader *)0x0;
                          }
                          else {
                            local_1010 = (DTSStreamReader *)
                                         __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                                        &DTSStreamReader::typeinfo,0);
                          }
                          DTSStreamReader::setDownconvertToDTS(local_1010,true);
                        }
                      }
                      else {
                        bVar4 = std::operator==(codecName,"A_AC3");
                        if (bVar4) {
                          h264Reader = (H264StreamReader *)operator_new(0x1c8);
                          AC3StreamReader::AC3StreamReader((AC3StreamReader *)h264Reader);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_3e0,"down-to-ac3",&local_3e1);
                          local_3c0._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(addParams,&local_3e0);
                          std::__cxx11::string::~string((string *)&local_3e0);
                          std::allocator<char>::~allocator(&local_3e1);
                          itr_8 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::end(addParams);
                          bVar4 = std::operator!=(&local_3c0,&itr_8);
                          if (bVar4) {
                            if (h264Reader == (H264StreamReader *)0x0) {
                              local_1040 = 0;
                            }
                            else {
                              local_1040 = __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo
                                                          ,&AC3StreamReader::typeinfo,0);
                            }
                            AC3Codec::setDownconvertToAC3((AC3Codec *)(local_1040 + 0xd8),true);
                          }
                        }
                        else {
                          bVar4 = std::operator==(codecName,"S_HDMV/PGS");
                          if (bVar4) {
                            h264Reader = (H264StreamReader *)operator_new(0x1e8);
                            PGSStreamReader::PGSStreamReader((PGSStreamReader *)h264Reader);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_418,"bottom-offset",&local_419);
                            local_3f8._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(addParams,&local_418);
                            std::__cxx11::string::~string((string *)&local_418);
                            std::allocator<char>::~allocator(&local_419);
                            local_428._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,&local_428);
                            if (bVar4) {
                              if (h264Reader == (H264StreamReader *)0x0) {
                                local_1070 = (PGSStreamReader *)0x0;
                              }
                              else {
                                local_1070 = (PGSStreamReader *)
                                             __dynamic_cast(h264Reader,
                                                            &AbstractStreamReader::typeinfo,
                                                            &PGSStreamReader::typeinfo,0);
                              }
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              iVar5 = strToInt32(pcVar9);
                              PGSStreamReader::setBottomOffset(local_1070,iVar5);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_450,"3d-plane",&local_451);
                            local_430 = (_Base_ptr)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::find(addParams,&local_450);
                            local_3f8._M_node = local_430;
                            std::__cxx11::string::~string((string *)&local_450);
                            std::allocator<char>::~allocator(&local_451);
                            fps_5 = (double)std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,(_Self *)&fps_5);
                            if (bVar4) {
                              if (h264Reader == (H264StreamReader *)0x0) {
                                local_10a0 = (PGSStreamReader *)0x0;
                              }
                              else {
                                local_10a0 = (PGSStreamReader *)
                                             __dynamic_cast(h264Reader,
                                                            &AbstractStreamReader::typeinfo,
                                                            &PGSStreamReader::typeinfo,0);
                              }
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              value = strToInt8u(pcVar9);
                              PGSStreamReader::setOffsetId(local_10a0,value);
                            }
                            dStack_468 = 0.0;
                            local_46a = 0;
                            local_46c = 0;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_498,"fps",&local_499);
                            local_478 = (_Base_ptr)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::find(addParams,&local_498);
                            local_3f8._M_node = local_478;
                            std::__cxx11::string::~string((string *)&local_498);
                            std::allocator<char>::~allocator(&local_499);
                            local_4a8._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,&local_4a8);
                            if (bVar4) {
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              dStack_468 = strToDouble(pcVar9);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_4d0,"video-width",&local_4d1);
                            local_4b0 = (_Base_ptr)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::find(addParams,&local_4d0);
                            local_3f8._M_node = local_4b0;
                            std::__cxx11::string::~string((string *)&local_4d0);
                            std::allocator<char>::~allocator(&local_4d1);
                            local_4e0._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,&local_4e0);
                            if (bVar4) {
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              local_46a = strToInt16u(pcVar9);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_508,"video-height",&local_509);
                            local_4e8 = (_Base_ptr)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::find(addParams,&local_508);
                            local_3f8._M_node = local_4e8;
                            std::__cxx11::string::~string((string *)&local_508);
                            std::allocator<char>::~allocator(&local_509);
                            local_518._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,&local_518);
                            if (bVar4) {
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              local_46c = strToInt16u(pcVar9);
                            }
                            if (h264Reader == (H264StreamReader *)0x0) {
                              local_1100 = (PGSStreamReader *)0x0;
                            }
                            else {
                              local_1100 = (PGSStreamReader *)
                                           __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo
                                                          ,&PGSStreamReader::typeinfo,0);
                            }
                            PGSStreamReader::setVideoInfo(local_1100,local_46a,local_46c,dStack_468)
                            ;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_540,"font-border",&local_541);
                            local_520 = (_Base_ptr)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::find(addParams,&local_540);
                            local_3f8._M_node = local_520;
                            std::__cxx11::string::~string((string *)&local_540);
                            std::allocator<char>::~allocator(&local_541);
                            srtReader = (SRTStreamReader *)
                                        std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::end(addParams);
                            bVar4 = std::operator!=(&local_3f8,(_Self *)&srtReader);
                            if (bVar4) {
                              if (h264Reader == (H264StreamReader *)0x0) {
                                local_1128 = (PGSStreamReader *)0x0;
                              }
                              else {
                                local_1128 = (PGSStreamReader *)
                                             __dynamic_cast(h264Reader,
                                                            &AbstractStreamReader::typeinfo,
                                                            &PGSStreamReader::typeinfo,0);
                              }
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator->(&local_3f8);
                              pcVar9 = (char *)std::__cxx11::string::c_str();
                              iVar5 = strToInt32(pcVar9);
                              PGSStreamReader::setFontBorder(local_1128,iVar5);
                            }
                          }
                          else {
                            bVar4 = std::operator==(codecName,"S_TEXT/UTF8");
                            if (!bVar4) {
                              std::__cxx11::ostringstream::ostringstream(local_948);
                              poVar7 = std::operator<<((ostream *)local_948,"Unsupported codec ");
                              std::operator<<(poVar7,(string *)codecName);
                              itr_9._M_node._7_1_ = 1;
                              pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
                              std::__cxx11::ostringstream::str();
                              VodCoreException::VodCoreException(pVVar8,0x1f5,&local_968);
                              itr_9._M_node._7_1_ = 0;
                              __cxa_throw(pVVar8,&VodCoreException::typeinfo,
                                          VodCoreException::~VodCoreException);
                            }
                            h264Reader = (H264StreamReader *)operator_new(0x188);
                            SRTStreamReader::SRTStreamReader((SRTStreamReader *)h264Reader);
                            font._48_8_ = h264Reader;
                            text_subtitles::Font::Font((Font *)local_590);
                            fps_6._6_2_ = 0;
                            fps_6._4_2_ = 0;
                            animation.fadeInDuration = 0.0;
                            animation.fadeOutDuration = 0.0;
                            text_subtitles::TextAnimation::TextAnimation
                                      ((TextAnimation *)&__range15);
                            __end15 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::begin(addParams);
                            addParam = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)std::
                                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::end(addParams);
                            while (bVar4 = std::operator!=(&__end15,(_Self *)&addParam), bVar4) {
                              local_5c8 = std::
                                          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator*(&__end15);
                              bVar4 = std::operator==(&local_5c8->first,"font-name");
                              if (bVar4) {
                                unquoteStr((string *)&s,&local_5c8->second);
                                std::__cxx11::string::operator=((string *)local_590,(string *)&s);
                                std::__cxx11::string::~string((string *)&s);
                              }
                              else {
                                bVar4 = std::operator==(&local_5c8->first,"font-size");
                                if (bVar4) {
                                  pcVar9 = (char *)std::__cxx11::string::c_str();
                                  font.m_name.field_2._8_4_ = strToInt32(pcVar9);
                                }
                                else {
                                  bVar4 = std::operator==(&local_5c8->first,"font-bold");
                                  if (bVar4) {
                                    font.m_name.field_2._12_4_ = font.m_name.field_2._12_4_ | 1;
                                  }
                                  else {
                                    bVar4 = std::operator==(&local_5c8->first,"font-italic");
                                    if (bVar4) {
                                      font.m_name.field_2._12_4_ = font.m_name.field_2._12_4_ | 2;
                                    }
                                    else {
                                      bVar4 = std::operator==(&local_5c8->first,"font-underline");
                                      if (bVar4) {
                                        font.m_name.field_2._12_4_ = font.m_name.field_2._12_4_ | 4;
                                      }
                                      else {
                                        bVar4 = std::operator==(&local_5c8->first,"font-strike-out")
                                        ;
                                        if (bVar4) {
                                          font.m_name.field_2._12_4_ =
                                               font.m_name.field_2._12_4_ | 8;
                                        }
                                        else {
                                          bVar4 = std::operator==(&local_5c8->first,"font-color");
                                          if (bVar4) {
                                            local_5f0 = &local_5c8->second;
                                            uVar6 = std::__cxx11::string::size();
                                            if (((uVar6 < 2) ||
                                                (pcVar9 = (char *)std::__cxx11::string::operator[]
                                                                            ((ulong)local_5f0),
                                                *pcVar9 != '0')) ||
                                               (pcVar9 = (char *)std::__cxx11::string::operator[]
                                                                           ((ulong)local_5f0),
                                               pbVar3 = local_5f0, *pcVar9 != 'x')) {
                                              uVar6 = std::__cxx11::string::empty();
                                              if (((uVar6 & 1) == 0) &&
                                                 (pcVar9 = (char *)std::__cxx11::string::operator[]
                                                                             ((ulong)local_5f0),
                                                 pbVar3 = local_5f0, *pcVar9 == 'x')) {
                                                std::__cxx11::string::size();
                                                std::__cxx11::string::substr
                                                          ((ulong)local_630,(ulong)pbVar3);
                                                pcVar9 = (char *)std::__cxx11::string::c_str();
                                                font.m_borderWidth = (float)strToInt32u(pcVar9,0x10)
                                                ;
                                                std::__cxx11::string::~string(local_630);
                                              }
                                              else {
                                                pcVar9 = (char *)std::__cxx11::string::c_str();
                                                font.m_borderWidth = (float)strToInt32u(pcVar9,10);
                                              }
                                            }
                                            else {
                                              std::__cxx11::string::size();
                                              std::__cxx11::string::substr
                                                        ((ulong)local_610,(ulong)pbVar3);
                                              pcVar9 = (char *)std::__cxx11::string::c_str();
                                              font.m_borderWidth = (float)strToInt32u(pcVar9,0x10);
                                              std::__cxx11::string::~string(local_610);
                                            }
                                            if (((uint)font.m_borderWidth & 0xff000000) == 0) {
                                              font.m_borderWidth =
                                                   (float)((uint)font.m_borderWidth | 0xff000000);
                                            }
                                          }
                                          else {
                                            bVar4 = std::operator==(&local_5c8->first,"line-spacing"
                                                                   );
                                            if (bVar4) {
                                              pcVar9 = (char *)std::__cxx11::string::c_str();
                                              font.m_charset = (uint32_t)strToFloat(pcVar9);
                                            }
                                            else {
                                              bVar4 = std::operator==(&local_5c8->first,
                                                                      "font-charset");
                                              if (bVar4) {
                                                pcVar9 = (char *)std::__cxx11::string::c_str();
                                                font.m_opts = strToInt32(pcVar9);
                                              }
                                              else {
                                                bVar4 = std::operator==(&local_5c8->first,
                                                                        "font-border");
                                                if (bVar4) {
                                                  pcVar9 = (char *)std::__cxx11::string::c_str();
                                                  font.m_size = (int)strToFloat(pcVar9);
                                                }
                                                else {
                                                  bVar4 = std::operator==(&local_5c8->first,"fps");
                                                  if (bVar4) {
                                                    pcVar9 = (char *)std::__cxx11::string::c_str();
                                                    animation = (TextAnimation)strToDouble(pcVar9);
                                                  }
                                                  else {
                                                    bVar4 = std::operator==(&local_5c8->first,
                                                                            "video-width");
                                                    if (bVar4) {
                                                      pcVar9 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      fps_6._6_2_ = strToInt16u(pcVar9);
                                                    }
                                                    else {
                                                      bVar4 = std::operator==(&local_5c8->first,
                                                                              "video-height");
                                                      if (bVar4) {
                                                        pcVar9 = (char *)std::__cxx11::string::c_str
                                                                                   ();
                                                        fps_6._4_2_ = strToInt16u(pcVar9);
                                                      }
                                                      else {
                                                        bVar4 = std::operator==(&local_5c8->first,
                                                                                "bottom-offset");
                                                        this = font._48_8_;
                                                        if (bVar4) {
                                                          pcVar9 = (char *)std::__cxx11::string::
                                                                           c_str();
                                                          iVar5 = strToInt32(pcVar9);
                                                          SRTStreamReader::setBottomOffset
                                                                    ((SRTStreamReader *)this,iVar5);
                                                        }
                                                        else {
                                                          bVar4 = std::operator==(&local_5c8->first,
                                                                                  "fadein-time");
                                                          if (bVar4) {
                                                            pcVar9 = (char *)std::__cxx11::string::
                                                                             c_str();
                                                            __range15._0_4_ = strToFloat(pcVar9);
                                                          }
                                                          else {
                                                            bVar4 = std::operator==(&local_5c8->
                                                                                     first,
                                                  "fadeout-time");
                                                  if (bVar4) {
                                                    pcVar9 = (char *)std::__cxx11::string::c_str();
                                                    __range15._4_4_ = strToFloat(pcVar9);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              std::
                              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator++(&__end15);
                            }
                            if (((fps_6._6_2_ == 0) || (fps_6._4_2_ == 0)) ||
                               (((double)animation == 0.0 && (!NAN((double)animation))))) {
                              std::__cxx11::ostringstream::ostringstream(local_7a8);
                              std::operator<<((ostream *)local_7a8,
                                              "video-width, video-height and fps parameters MUST be provided for SRT tracks"
                                             );
                              pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
                              std::__cxx11::ostringstream::str();
                              VodCoreException::VodCoreException(pVVar8,3,&local_7c8);
                              __cxa_throw(pVVar8,&VodCoreException::typeinfo,
                                          VodCoreException::~VodCoreException);
                            }
                            SRTStreamReader::setVideoInfo
                                      ((SRTStreamReader *)font._48_8_,fps_6._6_2_,fps_6._4_2_,
                                       (double)animation);
                            SRTStreamReader::setFont
                                      ((SRTStreamReader *)font._48_8_,(Font *)local_590);
                            SRTStreamReader::setAnimation
                                      ((SRTStreamReader *)font._48_8_,(TextAnimation *)&__range15);
                            text_subtitles::Font::~Font((Font *)local_590);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)codecName);
  if (*pcVar9 == 'A') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_998,"stretch",&local_999);
    local_978._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(addParams,&local_998);
    std::__cxx11::string::~string((string *)&local_998);
    std::allocator<char>::~allocator(&local_999);
    stretch = (double)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::end(addParams);
    bVar4 = std::operator!=(&local_978,(_Self *)&stretch);
    if (bVar4) {
      ppVar11 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_978);
      lVar10 = std::__cxx11::string::find((char)ppVar11 + ' ',0x2f);
      if (lVar10 == -1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->(&local_978);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        divPos = (size_t)strToDouble(pcVar9);
      }
      else {
        ppVar11 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_978);
        std::__cxx11::string::substr((ulong)((long)&secondStr.field_2 + 8),(ulong)&ppVar11->second);
        ppVar11 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_978);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->(&local_978);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&dFirst,(ulong)&ppVar11->second);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        dVar1 = strToDouble(pcVar9);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        dVar2 = strToDouble(pcVar9);
        if ((dVar2 == 0.0) && (!NAN(dVar2))) {
          std::__cxx11::ostringstream::ostringstream(local_b80);
          std::operator<<((ostream *)local_b80,"Second argument at stretch parameter can not be 0");
          pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(pVVar8,3,&local_ba0);
          __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        divPos = (size_t)(dVar1 / dVar2);
        std::__cxx11::string::~string((string *)&dFirst);
        std::__cxx11::string::~string((string *)(secondStr.field_2._M_local_buf + 8));
      }
      itr = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(addParams);
      bVar4 = std::operator!=(&local_978,&itr);
      if (bVar4) {
        if (h264Reader == (H264StreamReader *)0x0) {
          local_1230 = (SimplePacketizerReader *)0x0;
        }
        else {
          local_1230 = (SimplePacketizerReader *)
                       __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                      &SimplePacketizerReader::typeinfo,0);
        }
        SimplePacketizerReader::setStretch(local_1230,(double)divPos);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd8,"secondary",&local_bd9);
  local_bb8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(addParams,&local_bd8);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::allocator<char>::~allocator(&local_bd9);
  pipParams._12_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,(_Self *)&pipParams.vOffset);
  if (bVar4) {
    AbstractStreamReader::setIsSecondary((AbstractStreamReader *)h264Reader,true);
  }
  PIPParams::PIPParams((PIPParams *)local_bfc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c28,"pipCorner",&local_c29);
  local_c08 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(addParams,&local_c28);
  local_bb8._M_node = local_c08;
  std::__cxx11::string::~string((string *)&local_c28);
  std::allocator<char>::~allocator(&local_c29);
  local_c38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,&local_c38);
  if (bVar4) {
    ppVar11 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_bb8);
    local_bfc._4_4_ = pipCornerFromStr(&ppVar11->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60,"pipHOffset",&local_c61);
  local_c40 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(addParams,&local_c60);
  local_bb8._M_node = local_c40;
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator(&local_c61);
  local_c70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,&local_c70);
  if (bVar4) {
    ppVar11 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_bb8);
    pipParams.scaleIndex = strToInt32(&ppVar11->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"pipVOffset",&local_c99);
  local_c78 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(addParams,&local_c98);
  local_bb8._M_node = local_c78;
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator(&local_c99);
  local_ca8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,&local_ca8);
  if (bVar4) {
    ppVar11 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_bb8);
    pipParams.corner = strToInt32(&ppVar11->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd0,"pipLumma",&local_cd1);
  local_cb0 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(addParams,&local_cd0);
  local_bb8._M_node = local_cb0;
  std::__cxx11::string::~string((string *)&local_cd0);
  std::allocator<char>::~allocator(&local_cd1);
  local_ce0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,&local_ce0);
  if (bVar4) {
    ppVar11 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_bb8);
    pipParams.hOffset = strToInt32(&ppVar11->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"pipScale",&local_d09);
  local_ce8 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(addParams,&local_d08);
  local_bb8._M_node = local_ce8;
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  local_d18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar4 = std::operator!=(&local_bb8,&local_d18);
  if (bVar4) {
    ppVar11 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_bb8);
    local_bfc._0_4_ = pipScaleFromStr(&ppVar11->second);
  }
  AbstractStreamReader::setPipParams((AbstractStreamReader *)h264Reader,(PIPParams *)local_bfc);
  bVar4 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::empty(mplsInfo);
  if (!bVar4) {
    if (h264Reader == (H264StreamReader *)0x0) {
      local_12d0 = 0;
    }
    else {
      local_12d0 = __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                  &SimplePacketizerReader::typeinfo,0);
    }
    if (local_12d0 != 0) {
      if (h264Reader == (H264StreamReader *)0x0) {
        local_12e0 = (SimplePacketizerReader *)0x0;
      }
      else {
        local_12e0 = (SimplePacketizerReader *)
                     __dynamic_cast(h264Reader,&AbstractStreamReader::typeinfo,
                                    &SimplePacketizerReader::typeinfo,0);
      }
      SimplePacketizerReader::setMPLSInfo(local_12e0,mplsInfo);
    }
  }
  return (AbstractStreamReader *)h264Reader;
}

Assistant:

AbstractStreamReader* METADemuxer::createCodec(const string& codecName, const map<string, string>& addParams,
                                               const std::string& codecStreamName, const vector<MPLSPlayItem>& mplsInfo)
{
    AbstractStreamReader* rez = nullptr;
    if (codecName == "V_MPEG4/ISO/AVC" || codecName == "V_MPEG4/ISO/MVC")
    {
        auto h264Reader = new H264StreamReader();
        rez = h264Reader;
        if (codecName == "V_MPEG4/ISO/MVC")
            h264Reader->setIsSubStream(true);

        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<H264StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setRemovePulldown(true);

        itr = addParams.find("level");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setForceLevel(static_cast<uint8_t>(strToDouble(itr->second.c_str())) *
                                                                10);
        itr = addParams.find("insertSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("autoSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("forceSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertForce);
        }
        itr = addParams.find("contSPS");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setH264SPSCont(true);
        }
    }
    else if (codecName == "V_MPEGH/ISO/HEVC")
    {
        rez = new HEVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<HEVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MPEGI/ISO/VVC")
    {
        rez = new VVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MS/VFW/WVC1")
    {
        rez = new VC1StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VC1StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<VC1StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "V_MPEG-2")
    {
        rez = new MPEG2StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<MPEG2StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("ar");
        if (itr != addParams.end())
            dynamic_cast<MPEGStreamReader*>(rez)->setAspectRatio(arNameToCode(itr->second));

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<MPEG2StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "A_AAC")
        rez = new AACStreamReader();
    else if (codecName == "A_MP3")
        rez = new MpegAudioStreamReader();
    else if (codecName == "S_SUP")
        rez = new DVBSubStreamReader();
    else if (codecName == "A_LPCM")
        rez = new LPCMStreamReader();
    else if (codecName == "A_MLP")
        rez = new MLPStreamReader();
    else if (codecName == "A_DTS")
    {
        rez = new DTSStreamReader();
        auto itr = addParams.find("down-to-dts");
        if (itr != addParams.end())
            dynamic_cast<DTSStreamReader*>(rez)->setDownconvertToDTS(true);
    }
    else if (codecName == "A_AC3")
    {
        rez = new AC3StreamReader();
        auto itr = addParams.find("down-to-ac3");
        if (itr != addParams.end())
            dynamic_cast<AC3StreamReader*>(rez)->setDownconvertToAC3(true);
    }
    else if (codecName == "S_HDMV/PGS")
    {
        rez = new PGSStreamReader();
        auto itr = addParams.find("bottom-offset");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setBottomOffset(strToInt32(itr->second.c_str()));

        itr = addParams.find("3d-plane");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setOffsetId(strToInt8u(itr->second.c_str()));

        double fps = 0.0;
        uint16_t width = 0;
        uint16_t height = 0;
        itr = addParams.find("fps");
        if (itr != addParams.end())
            fps = strToDouble(itr->second.c_str());
        itr = addParams.find("video-width");
        if (itr != addParams.end())
            width = strToInt16u(itr->second.c_str());
        itr = addParams.find("video-height");
        if (itr != addParams.end())
            height = strToInt16u(itr->second.c_str());
        dynamic_cast<PGSStreamReader*>(rez)->setVideoInfo(width, height, fps);
        itr = addParams.find("font-border");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setFontBorder(strToInt32(itr->second.c_str()));
    }
    else if (codecName == "S_TEXT/UTF8")
    {
        auto srtReader = new SRTStreamReader();
        rez = srtReader;
        text_subtitles::Font font;
        uint16_t srtWidth = 0, srtHeight = 0;
        double fps = 0.0;
        text_subtitles::TextAnimation animation;
        for (const auto& addParam : addParams)
        {
            if (addParam.first == "font-name")
            {
                font.m_name = unquoteStr(addParam.second);
            }
            else if (addParam.first == "font-size")
                font.m_size = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-bold")
                font.m_opts |= text_subtitles::Font::BOLD;
            else if (addParam.first == "font-italic")
                font.m_opts |= text_subtitles::Font::ITALIC;
            else if (addParam.first == "font-underline")
                font.m_opts |= text_subtitles::Font::UNDERLINE;
            else if (addParam.first == "font-strike-out")
                font.m_opts |= text_subtitles::Font::STRIKE_OUT;
            else if (addParam.first == "font-color")
            {
                const string& s = addParam.second;
                if (s.size() >= 2 && s[0] == '0' && s[1] == 'x')
                    font.m_color = strToInt32u(s.substr(2, s.size() - 2).c_str(), 16);
                else if (!s.empty() && s[0] == 'x')
                    font.m_color = strToInt32u(s.substr(1, s.size() - 1).c_str(), 16);
                else
                    font.m_color = strToInt32u(s.c_str());
                if ((font.m_color & 0xff000000u) == 0)
                    font.m_color |= 0xff000000u;
            }
            else if (addParam.first == "line-spacing")
                font.m_lineSpacing = strToFloat(addParam.second.c_str());
            else if (addParam.first == "font-charset")
                font.m_charset = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-border")
                font.m_borderWidth = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fps")
            {
                fps = strToDouble(addParam.second.c_str());
            }
            else if (addParam.first == "video-width")
                srtWidth = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "video-height")
                srtHeight = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "bottom-offset")
                srtReader->setBottomOffset(strToInt32(addParam.second.c_str()));
            else if (addParam.first == "fadein-time")
                animation.fadeInDuration = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fadeout-time")
                animation.fadeOutDuration = strToFloat(addParam.second.c_str());
        }
        if (srtWidth == 0 || srtHeight == 0 || fps == 0.0)
            THROW(ERR_COMMON, "video-width, video-height and fps parameters MUST be provided for SRT tracks")
        srtReader->setVideoInfo(srtWidth, srtHeight, fps);
        srtReader->setFont(font);
        srtReader->setAnimation(animation);
    }
    else
        THROW(ERR_UNKNOWN_CODEC, "Unsupported codec " << codecName)

    if (codecName[0] == 'A')
    {
        auto itr = addParams.find("stretch");
        if (itr != addParams.end())
        {
            double stretch;
            size_t divPos = itr->second.find('/');
            if (divPos == std::string::npos)
                stretch = strToDouble(itr->second.c_str());
            else
            {
                string firstStr = itr->second.substr(0, divPos);
                string secondStr = itr->second.substr(divPos + 1, itr->second.size() - divPos - 1);
                double dFirst = strToDouble(firstStr.c_str());
                double dSecond = strToDouble(secondStr.c_str());
                if (dSecond != 0.0)
                    stretch = dFirst / dSecond;
                else
                    THROW(ERR_COMMON, "Second argument at stretch parameter can not be 0")
            }
            if (itr != addParams.end())
                dynamic_cast<SimplePacketizerReader*>(rez)->setStretch(stretch);
        }
    }
    auto itr = addParams.find("secondary");
    if (itr != addParams.end())
        rez->setIsSecondary(true);

    PIPParams pipParams;
    itr = addParams.find("pipCorner");
    if (itr != addParams.end())
        pipParams.corner = pipCornerFromStr(itr->second);
    itr = addParams.find("pipHOffset");
    if (itr != addParams.end())
        pipParams.hOffset = strToInt32(itr->second);
    itr = addParams.find("pipVOffset");
    if (itr != addParams.end())
        pipParams.vOffset = strToInt32(itr->second);
    itr = addParams.find("pipLumma");
    if (itr != addParams.end())
        pipParams.lumma = strToInt32(itr->second);
    itr = addParams.find("pipScale");
    if (itr != addParams.end())
        pipParams.scaleIndex = pipScaleFromStr(itr->second);
    rez->setPipParams(pipParams);

    if (!mplsInfo.empty() && dynamic_cast<SimplePacketizerReader*>(rez))
        dynamic_cast<SimplePacketizerReader*>(rez)->setMPLSInfo(mplsInfo);

    return rez;
}